

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O1

bool __thiscall
GdlBinaryExpression::CheckTypeAndUnits(GdlBinaryExpression *this,ExpressionType *pexptRet)

{
  GrcSymbolTableEntry *pGVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  ExpressionType *pEVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  _Alloc_hider _Var10;
  ExpressionType expt2;
  ExpressionType expt1;
  ExpressionType local_680;
  ExpressionType local_67c;
  ExpressionType *local_678;
  string local_670;
  string local_650;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  iVar9 = (*this->m_pexpOperand1->_vptr_GdlExpression[10])(this->m_pexpOperand1,&local_67c);
  if ((char)iVar9 == '\0') {
    return false;
  }
  iVar9 = (*this->m_pexpOperand2->_vptr_GdlExpression[10])(this->m_pexpOperand2,&local_680);
  if ((char)iVar9 == '\0') {
    return false;
  }
  *pexptRet = local_67c;
  pGVar1 = this->m_psymOperator;
  local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
  local_678 = pexptRet;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"+","");
  bVar6 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_2f0);
  bVar8 = true;
  if (bVar6) {
LAB_0014caa9:
    bVar4 = false;
    bVar3 = false;
    bVar2 = false;
    bVar7 = false;
  }
  else {
    pGVar1 = this->m_psymOperator;
    local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"-","");
    bVar7 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_310);
    if (bVar7) goto LAB_0014caa9;
    pGVar1 = this->m_psymOperator;
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"*","");
    bVar8 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_330);
    if (bVar8) {
      bVar3 = false;
LAB_0014cb50:
      bVar2 = false;
LAB_0014cb52:
      bVar7 = false;
      bVar4 = true;
      bVar8 = true;
    }
    else {
      pGVar1 = this->m_psymOperator;
      local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d0,"/","");
      bVar8 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_5d0);
      if (bVar8) {
        bVar3 = true;
        goto LAB_0014cb50;
      }
      pGVar1 = this->m_psymOperator;
      local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5f0,"&","");
      bVar8 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_5f0);
      if (bVar8) {
        bVar3 = true;
        bVar2 = true;
        goto LAB_0014cb52;
      }
      pGVar1 = this->m_psymOperator;
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"|","");
      bVar8 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_350);
      bVar4 = true;
      bVar3 = true;
      bVar2 = true;
      bVar7 = true;
    }
  }
  if ((bVar7) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2)) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((bVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2)) {
    operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
  }
  if ((bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != &local_5d0.field_2)) {
    operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
  }
  if ((bVar4) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_330._M_dataplus._M_p != &local_330.field_2)) {
    operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
  }
  if ((!bVar6) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_310._M_dataplus._M_p != &local_310.field_2)) {
    operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
    operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
  }
  if (bVar8 != false) {
    if (local_680 == kexptSlotRef || local_67c == kexptSlotRef) {
      local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"Using \'","");
      GrcSymbolTableEntry::FullName_abi_cxx11_(&local_50,this->m_psymOperator);
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_230,"\' operator with slot indices","");
      GrcErrorList::AddItem
                (&g_errorList,true,0x837,&(this->super_GdlExpression).super_GdlObject,
                 (GrpLineAndFile *)0x0,&local_370,&local_50,&local_230,(string *)0x0,(string *)0x0,
                 (string *)0x0,(string *)0x0,(string *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      local_1f0._M_dataplus._M_p = local_370._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_370._M_dataplus._M_p == &local_370.field_2) {
        return false;
      }
      goto LAB_0014cd62;
    }
    if ((((kexptOne < local_67c) || ((0x3aU >> (local_67c & 0x1f) & 1) == 0)) ||
        (kexptOne < local_680)) || ((0x3aU >> (local_680 & 0x1f) & 1) == 0)) {
      local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_390,"Numeric expression expected as target of ","");
      GrcSymbolTableEntry::FullName_abi_cxx11_(&local_70,this->m_psymOperator);
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_250," operator.","");
      GrcErrorList::AddItem
                (&g_errorList,false,0x9c7,&(this->super_GdlExpression).super_GdlObject,
                 (GrpLineAndFile *)0x0,&local_390,&local_70,&local_250,(string *)0x0,(string *)0x0,
                 (string *)0x0,(string *)0x0,(string *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390._M_dataplus._M_p != &local_390.field_2) {
        operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
      }
    }
    pGVar1 = this->m_psymOperator;
    local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"+","");
    bVar8 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_3b0);
    bVar6 = true;
    if (!bVar8) {
      pGVar1 = this->m_psymOperator;
      local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"-","");
      bVar6 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_3d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
        operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
      operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
    }
    if (bVar6 == false) {
      pGVar1 = this->m_psymOperator;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"*","");
      bVar6 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      pEVar5 = local_678;
      if (bVar6) {
        if ((local_67c == kexptMeas) && (local_680 == kexptMeas)) {
          local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_d0,"Multiplying two measurements","");
          GrcErrorList::AddWarning
                    (&g_errorList,0x9c9,&(this->super_GdlExpression).super_GdlObject,&local_d0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
            operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
          }
        }
        if ((local_67c != kexptMeas) && (local_680 != kexptMeas)) {
          *pEVar5 = kexptNumber;
          return true;
        }
        *pEVar5 = kexptMeas;
        return true;
      }
      pGVar1 = this->m_psymOperator;
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"/","");
      bVar6 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      if (!bVar6) {
        return true;
      }
      if (local_680 == kexptZero) {
        local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Dividing by zero","");
        GrcErrorList::AddError
                  (&g_errorList,0x838,&(this->super_GdlExpression).super_GdlObject,&local_130);
        _Var10._M_p = local_130._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p == &local_130.field_2) {
          return true;
        }
      }
      else {
        if (local_680 != kexptMeas) {
          return true;
        }
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,"Divisor is a measurement","");
        GrcErrorList::AddWarning
                  (&g_errorList,0x9ca,&(this->super_GdlExpression).super_GdlObject,&local_110);
        local_130.field_2._M_allocated_capacity = local_110.field_2._M_allocated_capacity;
        _Var10._M_p = local_110._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_dataplus._M_p == &local_110.field_2) {
          return true;
        }
      }
      goto LAB_0014e048;
    }
    if ((local_67c == local_680) ||
       ((local_67c & ~kexptNumber) == kexptZero && local_680 - kexptNumber < 5)) {
LAB_0014d250:
      bVar6 = false;
    }
    else {
      bVar6 = local_680 != kexptZero;
      if (((local_680 & ~kexptNumber) == kexptZero) && (local_67c < (kexptPoint|kexptBoolean))) {
        if ((0x36U >> (local_67c & 0x1f) & 1) != 0) goto LAB_0014d250;
        if ((0x248U >> (local_67c & 0x1f) & 1) == 0) goto LAB_0014d650;
      }
      else {
LAB_0014d650:
        bVar6 = true;
      }
    }
    if (local_680 == kexptUnknown) {
      return true;
    }
    if (local_67c == kexptUnknown) {
      return true;
    }
    if (!bVar6) {
      return true;
    }
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_90,"Adding measurement to non-measurement","");
    GrcErrorList::AddWarning
              (&g_errorList,0x9c8,&(this->super_GdlExpression).super_GdlObject,&local_90);
    local_130.field_2._M_allocated_capacity = local_90.field_2._M_allocated_capacity;
    _Var10._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return true;
    }
    goto LAB_0014e048;
  }
  pGVar1 = this->m_psymOperator;
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"&&","");
  bVar8 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_3f0);
  bVar6 = true;
  if (!bVar8) {
    pGVar1 = this->m_psymOperator;
    local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_410,"||","");
    bVar6 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_410);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._M_dataplus._M_p != &local_410.field_2) {
      operator_delete(local_410._M_dataplus._M_p,local_410.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  pEVar5 = local_678;
  if (bVar6 != false) {
    if ((((kexptOne < local_67c) || ((0x34U >> (local_67c & 0x1f) & 1) == 0)) ||
        (kexptOne < local_680)) || ((0x34U >> (local_680 & 0x1f) & 1) == 0)) {
      local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_430,"Boolean expression expected as target of ","");
      GrcSymbolTableEntry::FullName_abi_cxx11_(&local_150,this->m_psymOperator);
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_270," operator","");
      GrcErrorList::AddItem
                (&g_errorList,false,0x9cb,&(this->super_GdlExpression).super_GdlObject,
                 (GrpLineAndFile *)0x0,&local_430,&local_150,&local_270,(string *)0x0,(string *)0x0,
                 (string *)0x0,(string *)0x0,(string *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != &local_150.field_2) {
        operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_430._M_dataplus._M_p != &local_430.field_2) {
        operator_delete(local_430._M_dataplus._M_p,local_430.field_2._M_allocated_capacity + 1);
      }
    }
    if ((local_67c == local_680) ||
       ((local_67c & ~kexptNumber) == kexptZero && local_680 - kexptNumber < 5)) {
LAB_0014cfae:
      bVar6 = false;
    }
    else {
      bVar6 = local_680 != kexptZero;
      if (((local_680 & ~kexptNumber) == kexptZero) && (local_67c < (kexptPoint|kexptBoolean))) {
        if ((0x36U >> (local_67c & 0x1f) & 1) != 0) goto LAB_0014cfae;
        if ((0x248U >> (local_67c & 0x1f) & 1) != 0) goto LAB_0014cfb0;
      }
      bVar6 = true;
    }
LAB_0014cfb0:
    if (((local_680 != kexptUnknown) && (local_67c != kexptUnknown)) && (bVar6)) {
      local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_170,"Logically combining expressions of different types","");
      GrcErrorList::AddWarning
                (&g_errorList,0x9cc,&(this->super_GdlExpression).super_GdlObject,&local_170);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170._M_dataplus._M_p != &local_170.field_2) {
        operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
      }
    }
    *pEVar5 = kexptBoolean;
    return true;
  }
  pGVar1 = this->m_psymOperator;
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"==","");
  bVar6 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_450);
  bVar8 = true;
  if (bVar6) {
LAB_0014d35a:
    bVar4 = false;
    bVar3 = false;
    bVar2 = false;
    bVar7 = false;
  }
  else {
    pGVar1 = this->m_psymOperator;
    local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_470,"!=","");
    bVar7 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_470);
    if (bVar7) goto LAB_0014d35a;
    pGVar1 = this->m_psymOperator;
    local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"<","");
    bVar8 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_490);
    if (bVar8) {
      bVar3 = false;
LAB_0014d6fe:
      bVar2 = false;
LAB_0014d700:
      bVar7 = false;
      bVar4 = true;
      bVar8 = true;
    }
    else {
      pGVar1 = this->m_psymOperator;
      local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_610,"<=","");
      bVar8 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_610);
      if (bVar8) {
        bVar3 = true;
        goto LAB_0014d6fe;
      }
      pGVar1 = this->m_psymOperator;
      local_630._M_dataplus._M_p = (pointer)&local_630.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_630,">","");
      bVar8 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_630);
      if (bVar8) {
        bVar3 = true;
        bVar2 = true;
        goto LAB_0014d700;
      }
      pGVar1 = this->m_psymOperator;
      local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b0,">=","");
      bVar8 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_4b0);
      bVar4 = true;
      bVar3 = true;
      bVar2 = true;
      bVar7 = true;
    }
  }
  if ((bVar7) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2)) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  if ((bVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630._M_dataplus._M_p != &local_630.field_2)) {
    operator_delete(local_630._M_dataplus._M_p,local_630.field_2._M_allocated_capacity + 1);
  }
  if ((bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_dataplus._M_p != &local_610.field_2)) {
    operator_delete(local_610._M_dataplus._M_p,local_610.field_2._M_allocated_capacity + 1);
  }
  if ((bVar4) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2)) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  if ((!bVar6) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2)) {
    operator_delete(local_470._M_dataplus._M_p,local_470.field_2._M_allocated_capacity + 1);
  }
  pEVar5 = local_678;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if (bVar8 != false) {
    if ((local_67c == local_680) ||
       ((local_67c & ~kexptNumber) == kexptZero && local_680 - kexptNumber < 5)) {
LAB_0014d81d:
      bVar6 = false;
    }
    else {
      bVar6 = local_680 != kexptZero;
      if (((local_680 & ~kexptNumber) == kexptZero) && (local_67c < (kexptPoint|kexptBoolean))) {
        if ((0x36U >> (local_67c & 0x1f) & 1) != 0) goto LAB_0014d81d;
        if ((0x248U >> (local_67c & 0x1f) & 1) != 0) goto LAB_0014d81f;
      }
      bVar6 = true;
    }
LAB_0014d81f:
    if (((local_680 != kexptUnknown) && (local_67c != kexptUnknown)) && (bVar6)) {
      local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_190,"Comparing expressions of different types","");
      GrcErrorList::AddWarning
                (&g_errorList,0x9cd,&(this->super_GdlExpression).super_GdlObject,&local_190);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_190._M_dataplus._M_p != &local_190.field_2) {
        operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
      }
    }
    *pEVar5 = kexptBoolean;
    return true;
  }
  pGVar1 = this->m_psymOperator;
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d0,"max","");
  bVar8 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_4d0);
  bVar6 = true;
  if (!bVar8) {
    pGVar1 = this->m_psymOperator;
    local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"min","");
    bVar6 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_4f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
      operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,local_4d0.field_2._M_allocated_capacity + 1);
  }
  if (bVar6 != false) {
    if ((local_680 != kexptOne &&
        ((local_680 & ~kexptBoolean) != kexptZero && (local_680 & ~kexptBoolean) != kexptNumber)) &&
        (local_67c != kexptOne &&
        ((local_67c & ~kexptBoolean) != kexptZero && (local_67c & ~kexptBoolean) != kexptNumber))) {
      local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_510,"Numeric expression expected as target of ","");
      GrcSymbolTableEntry::FullName_abi_cxx11_(&local_1b0,this->m_psymOperator);
      local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_290," function","");
      GrcErrorList::AddItem
                (&g_errorList,false,0x9ce,&(this->super_GdlExpression).super_GdlObject,
                 (GrpLineAndFile *)0x0,&local_510,&local_1b0,&local_290,(string *)0x0,(string *)0x0,
                 (string *)0x0,(string *)0x0,(string *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
        operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_510._M_dataplus._M_p != &local_510.field_2) {
        operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
      }
    }
    if ((local_67c == local_680) ||
       ((local_67c & ~kexptNumber) == kexptZero && local_680 - kexptNumber < 5)) {
LAB_0014daee:
      bVar6 = false;
    }
    else {
      bVar6 = local_680 != kexptZero;
      if (((local_680 & ~kexptNumber) == kexptZero) && (local_67c < (kexptPoint|kexptBoolean))) {
        if ((0x36U >> (local_67c & 0x1f) & 1) != 0) goto LAB_0014daee;
        if ((0x248U >> (local_67c & 0x1f) & 1) == 0) goto LAB_0014df40;
      }
      else {
LAB_0014df40:
        bVar6 = true;
      }
    }
    if (local_680 == kexptUnknown) {
      return true;
    }
    if (local_67c == kexptUnknown) {
      return true;
    }
    if (!bVar6) {
      return true;
    }
    local_650._M_dataplus._M_p = (pointer)&local_650.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_650,"Calculating ","");
    GrcSymbolTableEntry::FullName_abi_cxx11_(&local_1d0,this->m_psymOperator);
    local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2b0," of different expression types","");
    GrcErrorList::AddItem
              (&g_errorList,false,0x9cf,&(this->super_GdlExpression).super_GdlObject,
               (GrpLineAndFile *)0x0,&local_650,&local_1d0,&local_2b0,(string *)0x0,(string *)0x0,
               (string *)0x0,(string *)0x0,(string *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
      operator_delete(local_2b0._M_dataplus._M_p,local_2b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    local_130.field_2._M_allocated_capacity = local_650.field_2._M_allocated_capacity;
    _Var10._M_p = local_650._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_650._M_dataplus._M_p == &local_650.field_2) {
      return true;
    }
LAB_0014e048:
    operator_delete(_Var10._M_p,local_130.field_2._M_allocated_capacity + 1);
    return true;
  }
  pGVar1 = this->m_psymOperator;
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_530,"=","");
  bVar6 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_530);
  bVar8 = true;
  if (bVar6) {
LAB_0014dca0:
    bVar3 = false;
    bVar2 = false;
    bVar7 = false;
  }
  else {
    pGVar1 = this->m_psymOperator;
    local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"+=","");
    bVar7 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_550);
    if (bVar7) goto LAB_0014dca0;
    pGVar1 = this->m_psymOperator;
    local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_570,"-=","");
    bVar8 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_570);
    if (bVar8) {
      bVar2 = false;
LAB_0014e0e1:
      bVar7 = false;
      bVar3 = true;
      bVar8 = true;
    }
    else {
      pGVar1 = this->m_psymOperator;
      local_670._M_dataplus._M_p = (pointer)&local_670.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_670,"*=","");
      bVar8 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_670);
      if (bVar8) {
        bVar2 = true;
        goto LAB_0014e0e1;
      }
      pGVar1 = this->m_psymOperator;
      local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_590,"/=","");
      bVar8 = GrcSymbolTableEntry::MatchesOp(pGVar1,&local_590);
      bVar3 = true;
      bVar2 = true;
      bVar7 = true;
    }
  }
  if ((bVar7) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2)) {
    operator_delete(local_590._M_dataplus._M_p,local_590.field_2._M_allocated_capacity + 1);
  }
  if ((bVar2) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != &local_670.field_2)) {
    operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
  }
  if ((bVar3) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2)) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  if ((!bVar6) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2)) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,local_530.field_2._M_allocated_capacity + 1);
  }
  if (bVar8 == false) {
    local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_5b0,"Invalid binary operator: ","");
    GrcSymbolTableEntry::FullName_abi_cxx11_(&local_210,this->m_psymOperator);
    GrcErrorList::AddItem
              (&g_errorList,true,0x83a,&(this->super_GdlExpression).super_GdlObject,
               (GrpLineAndFile *)0x0,&local_5b0,&local_210,(string *)0x0,(string *)0x0,(string *)0x0
               ,(string *)0x0,(string *)0x0,(string *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_210._M_dataplus._M_p != &local_210.field_2) {
      operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
    }
    local_370.field_2._M_allocated_capacity = local_5b0.field_2._M_allocated_capacity;
    local_1f0._M_dataplus._M_p = local_5b0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_5b0._M_dataplus._M_p == &local_5b0.field_2) {
      return false;
    }
  }
  else {
    GrcSymbolTableEntry::FullName_abi_cxx11_(&local_1f0,this->m_psymOperator);
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2d0," assignment operator not permitted in expression","");
    GrcErrorList::AddItem
              (&g_errorList,true,0x839,&(this->super_GdlExpression).super_GdlObject,
               (GrpLineAndFile *)0x0,&local_1f0,&local_2d0,(string *)0x0,(string *)0x0,(string *)0x0
               ,(string *)0x0,(string *)0x0,(string *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p,local_2d0.field_2._M_allocated_capacity + 1);
    }
    local_370.field_2._M_allocated_capacity = local_1f0.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p == &local_1f0.field_2) {
      return false;
    }
  }
LAB_0014cd62:
  operator_delete(local_1f0._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
  return false;
}

Assistant:

bool GdlBinaryExpression::CheckTypeAndUnits(ExpressionType * pexptRet)
{
	ExpressionType expt1;
	if (!m_pexpOperand1->CheckTypeAndUnits(&expt1))
		return false;
	ExpressionType expt2;
	if (!m_pexpOperand2->CheckTypeAndUnits(&expt2))
		return false;

	*pexptRet = expt1;	// unless changed below

	if (m_psymOperator->MatchesOp("+") || m_psymOperator->MatchesOp("-") ||
		m_psymOperator->MatchesOp("*") || m_psymOperator->MatchesOp("/") ||
		m_psymOperator->MatchesOp("&") || m_psymOperator->MatchesOp("|"))
	{
		//	Additive, multiplicative
		if (expt1 == kexptSlotRef || expt2 == kexptSlotRef)
		{
			g_errorList.AddError(2103, this,
				"Using '",
				m_psymOperator->FullName(),
				"' operator with slot indices");
			return false;
		}
		if ((expt1 != kexptNumber && expt1 != kexptMeas &&
				expt1 != kexptZero && expt1 != kexptOne) ||
			(expt2 != kexptNumber && expt2 != kexptMeas &&
				expt2 != kexptZero && expt2 != kexptOne))
		{
			g_errorList.AddWarning(2503, this,
				"Numeric expression expected as target of ",
				m_psymOperator->FullName(),
				" operator.");
		}

		if (m_psymOperator->MatchesOp("+") || m_psymOperator->MatchesOp("-"))
		{
			if (!EquivalentTypes(expt1, expt2) && expt1 != kexptUnknown && expt2 != kexptUnknown)
				g_errorList.AddWarning(2504, this,
					"Adding measurement to non-measurement");
		}
		else if (m_psymOperator->MatchesOp("*"))
		{
			if (expt1 == kexptMeas && expt2 == kexptMeas)
				g_errorList.AddWarning(2505, this,
					"Multiplying two measurements");

			if (expt1 == kexptMeas || expt2 == kexptMeas)
				*pexptRet = kexptMeas;
			else
				*pexptRet = kexptNumber;
		}
		else if (m_psymOperator->MatchesOp("/"))
		{
			if (expt2 == kexptMeas)
				g_errorList.AddWarning(2506, this, "Divisor is a measurement");
			else if (expt2 == kexptZero)
				g_errorList.AddError(2104, this, "Dividing by zero");
		}
	}
	else if (m_psymOperator->MatchesOp("&&") || m_psymOperator->MatchesOp("||"))
	{
		//	Logical
		if ((expt1 != kexptBoolean && expt1 != kexptZero && expt1 != kexptOne) ||
			(expt2 != kexptBoolean && expt2 != kexptZero && expt2 != kexptOne))
		{
			g_errorList.AddWarning(2507, this,
				"Boolean expression expected as target of ",
				m_psymOperator->FullName(),
				" operator");
		}
		if (!EquivalentTypes(expt1, expt2) && expt1 != kexptUnknown && expt2 != kexptUnknown)
			g_errorList.AddWarning(2508, this,
				"Logically combining expressions of different types");

		*pexptRet = kexptBoolean;
	}
	else if (m_psymOperator->MatchesOp("==") || m_psymOperator->MatchesOp("!=") ||
		m_psymOperator->MatchesOp("<") || m_psymOperator->MatchesOp("<=") ||
		m_psymOperator->MatchesOp(">") || m_psymOperator->MatchesOp(">="))
	{
		//	Comparative
		if (!EquivalentTypes(expt1, expt2) && expt1 != kexptUnknown && expt2 != kexptUnknown)
			g_errorList.AddWarning(2509, this,
				"Comparing expressions of different types");

		*pexptRet = kexptBoolean;
	}
	else if (m_psymOperator->MatchesOp("max") || m_psymOperator->MatchesOp("min"))
	{
		//	Functional
		if (expt1 != kexptNumber && expt1 != kexptMeas &&
			expt1 != kexptSlotRef && expt1 != kexptZero && expt1 != kexptOne &&
			expt2 != kexptNumber && expt2 != kexptMeas &&
			expt2 != kexptSlotRef && expt2 != kexptZero && expt2 != kexptOne)
		{
			g_errorList.AddWarning(2510, this,
				"Numeric expression expected as target of ",
				m_psymOperator->FullName(),
				" function");
		}
		if (!EquivalentTypes(expt1, expt2) && expt1 != kexptUnknown && expt2 != kexptUnknown)
			g_errorList.AddWarning(2511, this,
				"Calculating ",
				m_psymOperator->FullName(),
				" of different expression types");
	}
	else if (m_psymOperator->MatchesOp("=") ||
		m_psymOperator->MatchesOp("+=") || m_psymOperator->MatchesOp("-=") ||
		m_psymOperator->MatchesOp("*=") || m_psymOperator->MatchesOp("/="))
	{
		//	Assignment
		g_errorList.AddError(2105, this,
			m_psymOperator->FullName(),
			" assignment operator not permitted in expression");
		return false;
	}
	else
	{
		g_errorList.AddError(2106, this,
			"Invalid binary operator: ",
			m_psymOperator->FullName());
		return false;
	}

	return true;
}